

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O0

void Super2_Precompute(int nInputs,int nLevels,int fVerbose)

{
  Super2_Man_t *pMan_00;
  abctime aVar1;
  Super2_Lib_t *pSVar2;
  abctime aVar3;
  abctime clk;
  int Level;
  Super2_Lib_t *pLibNext;
  Super2_Lib_t *pLibCur;
  Super2_Man_t *pMan;
  int fVerbose_local;
  int nLevels_local;
  int nInputs_local;
  
  if (nInputs < 6) {
    pMan_00 = Super2_ManStart();
    pLibNext = Super2_LibFirst(pMan_00,nInputs);
    printf("Computing supergates for %d inputs and %d levels:\n",(ulong)(uint)nInputs,
           (ulong)(uint)nLevels);
    for (clk._4_4_ = 1; (int)clk._4_4_ <= nLevels; clk._4_4_ = clk._4_4_ + 1) {
      aVar1 = Abc_Clock();
      pSVar2 = Super2_LibCompute(pMan_00,pLibNext);
      pSVar2->nLevels = clk._4_4_;
      Super2_LibStop(pLibNext);
      printf("Level %d:  Tried = %7d.  Computed = %7d.  ",(ulong)clk._4_4_,
             (ulong)(uint)pMan_00->nTried,(ulong)(uint)pSVar2->nGates);
      Abc_Print(1,"%s =","Runtime");
      aVar3 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar1) * 1.0) / 1000000.0);
      fflush(_stdout);
      pLibNext = pSVar2;
    }
    printf("Writing the output file...\n");
    fflush(_stdout);
    Super2_LibWrite(pLibNext);
    Super2_LibStop(pLibNext);
    Super2_ManStop(pMan_00);
    return;
  }
  __assert_fail("nInputs < 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/super/superAnd.c"
                ,0x78,"void Super2_Precompute(int, int, int)");
}

Assistant:

void Super2_Precompute( int nInputs, int nLevels, int fVerbose )
{
    Super2_Man_t * pMan;
    Super2_Lib_t * pLibCur, * pLibNext;
    int Level;
    abctime clk;

    assert( nInputs < 6 );

    // start the manager
    pMan = Super2_ManStart();

    // get the starting supergates
    pLibCur = Super2_LibFirst( pMan, nInputs );

    // perform the computation of supergates
printf( "Computing supergates for %d inputs and %d levels:\n", nInputs, nLevels );
    for ( Level = 1; Level <= nLevels; Level++ )
    {
clk = Abc_Clock();
        pLibNext = Super2_LibCompute( pMan, pLibCur );
        pLibNext->nLevels = Level;
        Super2_LibStop( pLibCur );
        pLibCur = pLibNext;
printf( "Level %d:  Tried = %7d.  Computed = %7d.  ", Level, pMan->nTried, pLibCur->nGates );
ABC_PRT( "Runtime", Abc_Clock() - clk );
fflush( stdout );
    }

printf( "Writing the output file...\n" );
fflush( stdout );
    // write them into a file
    Super2_LibWrite( pLibCur );
    Super2_LibStop( pLibCur );

    // stop the manager
    Super2_ManStop( pMan );
}